

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SQLiteBuildDB.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_378fef::SQLiteBuildDB::buildComplete(SQLiteBuildDB *this)

{
  int iVar1;
  int __fd;
  int result;
  lock_guard<std::mutex> guard;
  SQLiteBuildDB *this_local;
  
  guard._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&stack0xffffffffffffffe8,&this->dbMutex);
  __fd = 0x371b74;
  iVar1 = sqlite3_exec(this->db,"END;",0,0);
  if (iVar1 == 0) {
    close(this,__fd);
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&stack0xffffffffffffffe8);
    return;
  }
  __assert_fail("result == SQLITE_OK",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/SQLiteBuildDB.cpp"
                ,0x2bf,"virtual void (anonymous namespace)::SQLiteBuildDB::buildComplete()");
}

Assistant:

virtual void buildComplete() override {
    std::lock_guard<std::mutex> guard(dbMutex);

    // Sync changes to disk.
    int result = sqlite3_exec(db, "END;", nullptr, nullptr, nullptr);
    assert(result == SQLITE_OK);
    (void)result;

    // We close the connection whenever a build completes so that we release
    // any locks that we may have on the file.
    close();
  }